

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::CheckMultipleOutputs
          (cmLocalUnixMakefileGenerator3 *this,bool verbose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  string *source;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairs;
  ostringstream msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = (this->super_cmLocalGenerator).Makefile;
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_MULTIPLE_OUTPUT_PAIRS","");
  __s = cmMakefile::GetDefinition(this_00,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar3);
    cmSystemTools::ExpandListArgument(local_1a8,&local_1e8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if (local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      source = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      do {
        if (source == local_1e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
        bVar2 = cmsys::SystemTools::FileExists((source->_M_dataplus)._M_p);
        if (bVar2) {
          bVar2 = cmsys::SystemTools::FileExists(source[-1]._M_dataplus._M_p);
          if (!bVar2) {
            if (verbose) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Deleting primary custom command output \"",0x28);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(source->_M_dataplus)._M_p,
                                  source->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"\" because another output \"",0x1a);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,source[-1]._M_dataplus._M_p,source[-1]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" does not exist.",0x11);
              std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              cmSystemTools::Stdout((char *)local_1c8);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
            cmsys::SystemTools::RemoveFile(source);
          }
        }
        psVar5 = source + 1;
        source = source + 2;
      } while (psVar5 != local_1e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CheckMultipleOutputs(bool verbose)
{
  cmMakefile* mf = this->Makefile;

  // Get the string listing the multiple output pairs.
  const char* pairs_string = mf->GetDefinition("CMAKE_MULTIPLE_OUTPUT_PAIRS");
  if(!pairs_string)
    {
    return;
    }

  // Convert the string to a list and preserve empty entries.
  std::vector<std::string> pairs;
  cmSystemTools::ExpandListArgument(pairs_string, pairs, true);
  for(std::vector<std::string>::const_iterator i = pairs.begin();
      i != pairs.end() && (i+1) != pairs.end();)
    {
    const std::string& depender = *i++;
    const std::string& dependee = *i++;

    // If the depender is missing then delete the dependee to make
    // sure both will be regenerated.
    if(cmSystemTools::FileExists(dependee.c_str()) &&
       !cmSystemTools::FileExists(depender.c_str()))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Deleting primary custom command output \"" << dependee
            << "\" because another output \""
            << depender << "\" does not exist." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
        }
      cmSystemTools::RemoveFile(dependee);
      }
    }
}